

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

IceTSparseImage icetSparseImageAssignBuffer(IceTVoid *buffer,IceTSizeType width,IceTSizeType height)

{
  IceTEnum IVar1;
  undefined8 in_RAX;
  int iVar2;
  IceTPointerArithmetic buffer_begin;
  IceTEnum color_format;
  undefined8 local_28;
  
  if (buffer == (IceTVoid *)0x0) {
    icetRaiseDiagnostic("Tried to create sparse image with NULL buffer.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x191);
  }
  else {
    local_28 = in_RAX;
    icetGetEnumv(9,(IceTEnum *)&local_28);
    icetGetEnumv(10,(IceTEnum *)((long)&local_28 + 4));
    IVar1 = (IceTEnum)local_28;
    if ((IceTEnum)local_28 - 0xc003 < 0xfffffffd) {
      icetRaiseDiagnostic("Invalid color format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x19d);
      local_28 = CONCAT44(local_28._4_4_,0xc000);
      IVar1 = 0xc000;
    }
    iVar2 = local_28._4_4_;
    if (local_28._4_4_ - 0xd002U < 0xfffffffe) {
      icetRaiseDiagnostic("Invalid depth format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x1a2);
      iVar2 = 0xd000;
      IVar1 = (IceTEnum)local_28;
    }
    *(undefined4 *)buffer = 0x4d6000;
    *(IceTEnum *)((long)buffer + 4) = IVar1;
    *(int *)((long)buffer + 8) = iVar2;
    *(IceTSizeType *)((long)buffer + 0xc) = width;
    *(IceTSizeType *)((long)buffer + 0x10) = height;
    *(IceTSizeType *)((long)buffer + 0x14) = height * width;
    *(IceTSizeType *)((long)buffer + 0x1c) = height * width;
    *(undefined4 *)((long)buffer + 0x20) = 0;
    *(undefined4 *)((long)buffer + 0x18) = 0x24;
  }
  return (IceTSparseImage)buffer;
}

Assistant:

IceTSparseImage icetSparseImageAssignBuffer(IceTVoid *buffer,
                                            IceTSizeType width,
                                            IceTSizeType height)
{
    IceTSparseImage image;
    IceTEnum color_format, depth_format;
    IceTInt *header;

    image.opaque_internals = buffer;

    if (buffer == NULL) {
        icetRaiseError("Tried to create sparse image with NULL buffer.",
                       ICET_INVALID_VALUE);
        return image;
    }

    icetGetEnumv(ICET_COLOR_FORMAT, &color_format);
    icetGetEnumv(ICET_DEPTH_FORMAT, &depth_format);

    header = ICET_IMAGE_HEADER(image);

    if (   (color_format != ICET_IMAGE_COLOR_RGBA_UBYTE)
        && (color_format != ICET_IMAGE_COLOR_RGBA_FLOAT)
        && (color_format != ICET_IMAGE_COLOR_NONE) ) {
        icetRaiseError("Invalid color format.", ICET_INVALID_ENUM);
        color_format = ICET_IMAGE_COLOR_NONE;
    }
    if (   (depth_format != ICET_IMAGE_DEPTH_FLOAT)
        && (depth_format != ICET_IMAGE_DEPTH_NONE) ) {
        icetRaiseError("Invalid depth format.", ICET_INVALID_ENUM);
        depth_format = ICET_IMAGE_DEPTH_NONE;
    }

    header[ICET_IMAGE_MAGIC_NUM_INDEX]          = ICET_SPARSE_IMAGE_MAGIC_NUM;
    header[ICET_IMAGE_COLOR_FORMAT_INDEX]       = color_format;
    header[ICET_IMAGE_DEPTH_FORMAT_INDEX]       = depth_format;
    header[ICET_IMAGE_WIDTH_INDEX]              = (IceTInt)width;
    header[ICET_IMAGE_HEIGHT_INDEX]             = (IceTInt)height;
    header[ICET_IMAGE_MAX_NUM_PIXELS_INDEX]     = (IceTInt)(width*height);
    header[ICET_IMAGE_ACTUAL_BUFFER_SIZE_INDEX] = 0;

  /* Make sure the runlengths are valid. */
    icetClearSparseImage(image);

    return image;
}